

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void r8vec2_print(int n,double *a1,double *a2,string *title)

{
  ostream *poVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (0 < n) {
    uVar2 = 0;
    do {
      *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 6;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
      poVar1 = std::ostream::_M_insert<double>(a1[uVar2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
      poVar1 = std::ostream::_M_insert<double>(a2[uVar2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

void r8vec2_print ( int n, double a1[], double a2[], std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC2_PRINT prints an R8VEC2.
//
//  Discussion:
//
//    An R8VEC2 is a dataset consisting of N pairs of real values, stored
//    as two separate vectors A1 and A2.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    19 November 2002
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components of the vector.
//
//    Input, double A1[N], double A2[N], the vectors to be printed.
//
//    Input, string TITLE, a title.
//
{
  int i;

  std::cout << "\n";
  std::cout << title << "\n";
  std::cout << "\n";
  for ( i = 0; i <= n - 1; i++ )
  {
    std::cout << std::setw(6)  << i
         << ": " << std::setw(14) << a1[i]
         << "  " << std::setw(14) << a2[i] << "\n";
  }

  return;
}